

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_GIF.cpp
# Opt level: O1

int __thiscall Am_GIF_Image::load_gif_colormap(Am_GIF_Image *this,ifstream *ifs,int flags)

{
  int iVar1;
  undefined1 auVar2 [16];
  Am_RGB_Value *pAVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uchar buf [3];
  byte local_2b;
  byte local_2a;
  byte local_29;
  
  (this->super_Am_Generic_Image).iminfo.num_colors = 2 << ((byte)flags & 7);
  pAVar3 = (this->super_Am_Generic_Image).color_map;
  if (pAVar3 != (Am_RGB_Value *)0x0) {
    operator_delete__(pAVar3);
  }
  iVar1 = (this->super_Am_Generic_Image).iminfo.num_colors;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar1;
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(6),8) == 0) {
    uVar4 = SUB168(auVar2 * ZEXT816(6),0);
  }
  pAVar3 = (Am_RGB_Value *)operator_new__(uVar4);
  if (iVar1 != 0) {
    memset(pAVar3,0,(((long)iVar1 * 6 - 6U) / 6) * 6 + 6);
  }
  (this->super_Am_Generic_Image).color_map = pAVar3;
  if (0 < (this->super_Am_Generic_Image).iminfo.num_colors) {
    lVar5 = 4;
    lVar6 = 0;
    do {
      std::istream::read((char *)ifs,(long)&local_2b);
      pAVar3 = (this->super_Am_Generic_Image).color_map;
      *(ushort *)((long)pAVar3 + lVar5 + -4) = (ushort)local_2b;
      *(ushort *)((long)pAVar3 + lVar5 + -2) = (ushort)local_2a;
      *(ushort *)((long)&pAVar3->red + lVar5) = (ushort)local_29;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 6;
    } while (lVar6 < (this->super_Am_Generic_Image).iminfo.num_colors);
  }
  return 1;
}

Assistant:

int
Am_GIF_Image::load_gif_colormap(std::ifstream &ifs, int flags)
{
  //  iminfo.depth = CTSIZE(flags) + 1; set in caller
  //  iminfo.num_colors = 1 << iminfo.depth;
  iminfo.num_colors = 1 << (CTSIZE(flags) + 1);
  // if we have a color map, delete it before reallocating
  if (color_map != nullptr)
    delete[] color_map;
  color_map = new Am_RGB_Value[iminfo.num_colors];
  if (color_map == nullptr)
    return 0; // failure
  int i;
  unsigned char buf[3];
  for (i = 0; i < iminfo.num_colors; i++) {
    // ifs.read(buf, 3);  MSL
    ifs.read((char *)buf, 3);
    color_map[i].red = buf[0];
    color_map[i].green = buf[1];
    color_map[i].blue = buf[2];
  }
  return 1;
}